

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resonance.test.cpp
# Opt level: O3

void verifyChunk(Resonance *chunk)

{
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  AssertionHandler catchAssertionHandler;
  double local_d0;
  AssertionHandler local_c8;
  ITransientExpression local_80;
  double *local_70;
  WithinRelMatcher *local_68;
  WithinRelMatcher local_60;
  
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x25;
  macroName.m_size = 10;
  macroName.m_start = "CHECK_THAT";
  capturedExpression.m_size = 0x1b;
  capturedExpression.m_start = "1., WithinRel( chunk.ER() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName,(SourceLineInfo *)&local_60,capturedExpression,ContinueOnFailure);
  local_d0 = 1.0;
  Catch::Matchers::WithinRel
            (&local_60,
             *(chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x26;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x28;
  capturedExpression_00.m_start = "1., WithinRel( chunk.resonanceEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_00,(SourceLineInfo *)&local_60,capturedExpression_00,
             ContinueOnFailure);
  local_d0 = 1.0;
  Catch::Matchers::WithinRel
            (&local_60,
             *(chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x27;
  macroName_01.m_size = 10;
  macroName_01.m_start = "CHECK_THAT";
  capturedExpression_01.m_size = 0x1b;
  capturedExpression_01.m_start = "2., WithinRel( chunk.AJ() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_01,(SourceLineInfo *)&local_60,capturedExpression_01,
             ContinueOnFailure);
  local_d0 = 2.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       &DAT_00000028;
  macroName_02.m_size = 10;
  macroName_02.m_start = "CHECK_THAT";
  capturedExpression_02.m_size = 0x1d;
  capturedExpression_02.m_start = "2., WithinRel( chunk.spin() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_02,(SourceLineInfo *)&local_60,capturedExpression_02,
             ContinueOnFailure);
  local_d0 = 2.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x29;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x1b;
  capturedExpression_03.m_start = "3., WithinRel( chunk.GN() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_03,(SourceLineInfo *)&local_60,capturedExpression_03,
             ContinueOnFailure);
  local_d0 = 3.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2a;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x25;
  capturedExpression_04.m_start = "3., WithinRel( chunk.neutronWidth() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_04,(SourceLineInfo *)&local_60,capturedExpression_04,
             ContinueOnFailure);
  local_d0 = 3.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2b;
  macroName_05.m_size = 10;
  macroName_05.m_start = "CHECK_THAT";
  capturedExpression_05.m_size = 0x1b;
  capturedExpression_05.m_start = "4., WithinRel( chunk.GG() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_05,(SourceLineInfo *)&local_60,capturedExpression_05,
             ContinueOnFailure);
  local_d0 = 4.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2c;
  macroName_06.m_size = 10;
  macroName_06.m_start = "CHECK_THAT";
  capturedExpression_06.m_size = 0x23;
  capturedExpression_06.m_start = "4., WithinRel( chunk.gammaWidth() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_06,(SourceLineInfo *)&local_60,capturedExpression_06,
             ContinueOnFailure);
  local_d0 = 4.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2d;
  macroName_07.m_size = 10;
  macroName_07.m_start = "CHECK_THAT";
  capturedExpression_07.m_size = 0x1c;
  capturedExpression_07.m_start = "5., WithinRel( chunk.GFA() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_07,(SourceLineInfo *)&local_60,capturedExpression_07,
             ContinueOnFailure);
  local_d0 = 5.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[4]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2e;
  macroName_08.m_size = 10;
  macroName_08.m_start = "CHECK_THAT";
  capturedExpression_08.m_size = 0x2a;
  capturedExpression_08.m_start = "5., WithinRel( chunk.firstFissionWidth() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_08,(SourceLineInfo *)&local_60,capturedExpression_08,
             ContinueOnFailure);
  local_d0 = 5.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[4]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2f;
  macroName_09.m_size = 10;
  macroName_09.m_start = "CHECK_THAT";
  capturedExpression_09.m_size = 0x1c;
  capturedExpression_09.m_start = "6., WithinRel( chunk.GFB() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_09,(SourceLineInfo *)&local_60,capturedExpression_09,
             ContinueOnFailure);
  local_d0 = 6.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[5]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15f004;
  local_60.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x30;
  macroName_10.m_size = 10;
  macroName_10.m_start = "CHECK_THAT";
  capturedExpression_10.m_size = 0x2b;
  capturedExpression_10.m_start = "6., WithinRel( chunk.secondFissionWidth() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,macroName_10,(SourceLineInfo *)&local_60,capturedExpression_10,
             ContinueOnFailure);
  local_d0 = 6.0;
  Catch::Matchers::WithinRel
            (&local_60,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[5]);
  local_80.m_result = Catch::Matchers::WithinRelMatcher::match(&local_60,&local_d0);
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00184310;
  local_70 = &local_d0;
  local_68 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_60);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunk( const Resonance& chunk ) {

  CHECK_THAT( 1., WithinRel( chunk.ER() ) );
  CHECK_THAT( 1., WithinRel( chunk.resonanceEnergy() ) );
  CHECK_THAT( 2., WithinRel( chunk.AJ() ) );
  CHECK_THAT( 2., WithinRel( chunk.spin() ) );
  CHECK_THAT( 3., WithinRel( chunk.GN() ) );
  CHECK_THAT( 3., WithinRel( chunk.neutronWidth() ) );
  CHECK_THAT( 4., WithinRel( chunk.GG() ) );
  CHECK_THAT( 4., WithinRel( chunk.gammaWidth() ) );
  CHECK_THAT( 5., WithinRel( chunk.GFA() ) );
  CHECK_THAT( 5., WithinRel( chunk.firstFissionWidth() ) );
  CHECK_THAT( 6., WithinRel( chunk.GFB() ) );
  CHECK_THAT( 6., WithinRel( chunk.secondFissionWidth() ) );
}